

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void __thiscall
DSBarInfo::DrawString
          (DSBarInfo *this,FFont *font,char *cstring,SBarInfoCoordinate x,SBarInfoCoordinate y,
          int xOffset,int yOffset,double Alpha,bool fullScreenOffsets,EColorRange translation,
          int spacing,bool drawshadow,int shadowX,int shadowY)

{
  BYTE BVar1;
  char cVar2;
  bool bVar3;
  MonospaceAlignment MVar4;
  SBarInfo *pSVar5;
  DSBarInfo *pDVar6;
  double dVar7;
  EColorRange range;
  int iVar8;
  FTexture *img;
  EColorRange EVar9;
  double dVar10;
  double local_c0;
  double rx;
  double ry;
  DSBarInfo *local_a8;
  double rw;
  BYTE *str;
  double rh;
  int local_84;
  double local_80;
  FRemapTable *local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined4 extraout_var;
  
  EVar9 = translation;
  if (translation == CR_BRICK) {
    EVar9 = NumTextColors;
  }
  local_c0 = (double)((int)x + spacing * 2 >> 1);
  local_80 = (double)((int)y >> 1);
  local_a8 = this;
  str = (BYTE *)cstring;
  local_70 = Alpha;
  local_78 = FFont::GetColorTranslation(font,translation);
  if (fullScreenOffsets) {
    if (hud_scale.Value == true) {
      local_60 = (double)local_a8->script->cleanX;
      local_68 = (double)local_a8->script->cleanY;
    }
    else {
      local_60 = 1.0;
      local_68 = 1.0;
    }
    if (((uint)x & 1) != 0) {
      if (hud_scale.Value == false) {
        dVar10 = 2.0;
      }
      else {
        dVar10 = local_60 + local_60;
      }
      local_c0 = local_c0 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width / dVar10;
    }
    if (((uint)y & 1) != 0) {
      if (hud_scale.Value == false) {
        dVar10 = 2.0;
      }
      else {
        dVar10 = local_68 + local_68;
      }
      local_80 = local_80 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height / dVar10;
    }
  }
  else {
    local_60 = 1.0;
    local_68 = 1.0;
  }
  local_38 = (double)xOffset;
  local_40 = (double)yOffset + local_80;
  local_48 = local_70 * 0.40625;
  local_50 = (double)shadowX * local_60;
  local_58 = (double)shadowY * local_68;
  pDVar6 = local_a8;
  do {
    while( true ) {
      while (BVar1 = *str, BVar1 == '\x1c') {
        str = str + 1;
        range = V_ParseFontColor(&str,translation,EVar9 + CR_UNDEFINED);
        if (range != CR_UNDEFINED) {
          local_78 = FFont::GetColorTranslation(font,range);
        }
      }
      if (BVar1 == '\0') {
        return;
      }
      if (BVar1 != ' ') break;
      if (pDVar6->script->spacingCharacter == '\0') {
        iVar8 = font->SpaceWidth;
      }
      else {
        iVar8 = (*font->_vptr_FFont[3])(font);
      }
      local_c0 = local_c0 + (double)iVar8;
      str = str + 1;
    }
    BVar1 = pDVar6->script->spacingCharacter;
    if (BVar1 == '\0') {
      BVar1 = *str;
    }
    local_84 = (*font->_vptr_FFont[3])(font,BVar1);
    iVar8 = (*font->_vptr_FFont[2])(font,(ulong)*str,&local_84);
    img = (FTexture *)CONCAT44(extraout_var,iVar8);
    if (img != (FTexture *)0x0) {
      cVar2 = local_a8->script->spacingCharacter;
      if (cVar2 == '\0') {
        local_c0 = local_c0 + (double)(img->LeftOffset + 1);
      }
      rx = local_c0 + local_38;
      ry = local_40;
      rw = (double)img->Width / (img->Scale).X;
      rh = (double)img->Height / (img->Scale).Y;
      if (cVar2 != '\0') {
        iVar8 = (*font->_vptr_FFont[3])(font);
        MVar4 = local_a8->script->spacingAlignment;
        if (MVar4 == ALIGN_RIGHT) {
          dVar10 = (double)iVar8 - rw;
        }
        else {
          if (MVar4 != ALIGN_CENTER) goto LAB_004c5981;
          dVar10 = (double)iVar8 * 0.5 - rw * 0.5;
        }
        rx = dVar10 + rx;
      }
LAB_004c5981:
      dVar10 = rx;
      if (fullScreenOffsets) {
        if (((vid_fps.Value == true) && (local_c0 < 0.0)) && (0.0 <= local_80)) {
          ry = ry + 10.0;
        }
        dVar7 = ry;
        if (hud_scale.Value == true) {
          rx = local_60 * rx;
          ry = local_68 * ry;
          rw = rw * local_60;
          rh = rh * local_68;
        }
        if (dVar10 < 0.0) {
          rx = (double)(screen->super_DSimpleCanvas).super_DCanvas.Width + rx;
        }
        if (dVar7 < 0.0) {
          ry = (double)(screen->super_DSimpleCanvas).super_DCanvas.Height + ry;
        }
      }
      else {
        rx = (double)*(int *)&(local_a8->super_DBaseStatusBar).super_DObject.field_0x24 + rx;
        bVar3 = (local_a8->super_DBaseStatusBar).Scaled;
        iVar8 = 200;
        if (bVar3 == true) {
          iVar8 = local_a8->script->resH;
        }
        pSVar5 = local_a8->script;
        ry = (double)(((local_a8->super_DBaseStatusBar).ST_Y - iVar8) + pSVar5->height) + ry;
        if (bVar3 == false) {
          ry = ry + (double)(200 - pSVar5->resH);
        }
        else {
          DCanvas::VirtualToRealCoords
                    ((DCanvas *)screen,&rx,&ry,&rw,&rh,(double)pSVar5->resW,(double)pSVar5->resH,
                     true,true);
        }
      }
      if (drawshadow) {
        DCanvas::DrawTexture
                  ((DCanvas *)screen,img,rx + local_50,ry + local_58,0x400013af,rw,rh,local_48,
                   0x400013b0,0x4000138c,0x4000138d,0,0);
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,rx,ry,0x400013af,rw,rh,local_70,0x400013b0,0x4000138e,
                 local_78,0x4000138c,0);
      if (local_a8->script->spacingCharacter == '\0') {
        iVar8 = ~(int)img->LeftOffset + local_84 + spacing;
      }
      else {
        iVar8 = (*font->_vptr_FFont[3])(font);
        iVar8 = iVar8 + spacing;
      }
      local_c0 = local_c0 + (double)iVar8;
    }
    str = str + 1;
    pDVar6 = local_a8;
  } while( true );
}

Assistant:

void DrawString(FFont *font, const char* cstring, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, EColorRange translation, int spacing=0, bool drawshadow=false, int shadowX=2, int shadowY=2) const
	{
		x += spacing;
		double ax = *x;
		double ay = *y;

		double xScale = 1.0;
		double yScale = 1.0;

		const BYTE* str = (const BYTE*) cstring;
		const EColorRange boldTranslation = EColorRange(translation ? translation - 1 : NumTextColors - 1);
		FRemapTable *remap = font->GetColorTranslation(translation);

		if(fullScreenOffsets)
		{
			if(hud_scale)
			{
				xScale = script->cleanX;
				yScale = script->cleanY;
			}
			adjustRelCenter(x.RelCenter(), y.RelCenter(), *x, *y, ax, ay, xScale, yScale);
		}
		while(*str != '\0')
		{
			if(*str == ' ')
			{
				if(script->spacingCharacter == '\0')
					ax += font->GetSpaceWidth();
				else
					ax += font->GetCharWidth((unsigned char) script->spacingCharacter);
				str++;
				continue;
			}
			else if(*str == TEXTCOLOR_ESCAPE)
			{
				EColorRange newColor = V_ParseFontColor(++str, translation, boldTranslation);
				if(newColor != CR_UNDEFINED)
					remap = font->GetColorTranslation(newColor);
				continue;
			}

			int width;
			if(script->spacingCharacter == '\0') //No monospace?
				width = font->GetCharWidth((unsigned char) *str);
			else
				width = font->GetCharWidth((unsigned char) script->spacingCharacter);
			FTexture* character = font->GetChar((unsigned char) *str, &width);
			if(character == NULL) //missing character.
			{
				str++;
				continue;
			}
			if(script->spacingCharacter == '\0') //If we are monospaced lets use the offset
				ax += (character->LeftOffset+1); //ignore x offsets since we adapt to character size

			double rx, ry, rw, rh;
			rx = ax + xOffset;
			ry = ay + yOffset;
			rw = character->GetScaledWidthDouble();
			rh = character->GetScaledHeightDouble();

			if(script->spacingCharacter != '\0')
			{
				double spacingSize = font->GetCharWidth((unsigned char) script->spacingCharacter);
				switch(script->spacingAlignment)
				{
					default:
						break;
					case SBarInfo::ALIGN_CENTER:
						rx += (spacingSize/2)-(rw/2);
						break;
					case SBarInfo::ALIGN_RIGHT:
						rx += spacingSize-rw;
						break;
				}
			}

			if(!fullScreenOffsets)
			{
				rx += ST_X;
				ry += ST_Y - (Scaled ? script->resH : 200) + script->height;
				if(Scaled)
					screen->VirtualToRealCoords(rx, ry, rw, rh, script->resW, script->resH, true);
				else
				{
					ry += (200 - script->resH);
				}
			}
			else
			{
				if(vid_fps && ax < 0 && ay >= 0)
					ry += 10;

				bool xright = rx < 0;
				bool ybot = ry < 0;

				if(hud_scale)
				{
					rx *= xScale;
					ry *= yScale;
					rw *= xScale;
					rh *= yScale;
				}
				if(xright)
					rx = SCREENWIDTH + rx;
				if(ybot)
					ry = SCREENHEIGHT + ry;
			}
			if(drawshadow)
			{
				double salpha = (Alpha *HR_SHADOW);
				double srx = rx + (shadowX*xScale);
				double sry = ry + (shadowY*yScale);
				screen->DrawTexture(character, srx, sry,
					DTA_DestWidthF, rw,
					DTA_DestHeightF, rh,
					DTA_AlphaF, salpha,
					DTA_FillColor, 0,
					TAG_DONE);
			}
			screen->DrawTexture(character, rx, ry,
				DTA_DestWidthF, rw,
				DTA_DestHeightF, rh,
				DTA_Translation, remap,
				DTA_AlphaF, Alpha,
				TAG_DONE);
			if(script->spacingCharacter == '\0')
				ax += width + spacing - (character->LeftOffset+1);
			else //width gets changed at the call to GetChar()
				ax += font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing;
			str++;
		}
	}